

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_15.cpp
# Opt level: O0

int main(void)

{
  exception *e;
  string local_80 [8];
  string out;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> numbers;
  string local_30 [8];
  string in;
  
  prompt_filename_abi_cxx11_((FileType *)local_30);
  read_numbers((vector<double,_std::allocator<double>_> *)local_60,local_30);
  prompt_filename_abi_cxx11_((FileType *)local_80);
  write_numbers((vector<double,_std::allocator<double>_> *)local_60,local_80);
  std::__cxx11::string::~string((string *)local_80);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  return 0;
}

Assistant:

int main()
{
	try
	{
		auto in = prompt_filename(FileType::in);
		auto numbers = read_numbers(in);
		auto out = prompt_filename(FileType::out);
		write_numbers(numbers, out);
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << '\n';
		return -1;
	}
	catch (...)
	{
		std::cerr << "Unknown exception occured.\n";
		return -2;
	}
}